

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
::reserve(vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
          *this,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  memory_resource *pmVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar8;
  int i;
  ulong uVar9;
  
  if (this->nAlloc < n) {
    pmVar3 = (this->alloc).memoryResource;
    iVar7 = (*pmVar3->_vptr_memory_resource[2])(pmVar3,n << 5,8);
    lVar8 = 0;
    for (uVar9 = 0; uVar9 < this->nStored; uVar9 = uVar9 + 1) {
      puVar1 = (undefined8 *)((long)&this->ptr->value + lVar8);
      uVar4 = puVar1[1];
      uVar5 = puVar1[2];
      uVar6 = puVar1[3];
      puVar2 = (undefined8 *)((long)&((PrimarySample *)CONCAT44(extraout_var,iVar7))->value + lVar8)
      ;
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      puVar2[2] = uVar5;
      puVar2[3] = uVar6;
      lVar8 = lVar8 + 0x20;
    }
    pmVar3 = (this->alloc).memoryResource;
    (*pmVar3->_vptr_memory_resource[3])(pmVar3,this->ptr,this->nAlloc << 5,8);
    this->nAlloc = n;
    this->ptr = (PrimarySample *)CONCAT44(extraout_var,iVar7);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }